

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::SetWriteThroughSymbolsSetForRegion
          (BackwardPass *this,BasicBlock *catchOrFinallyBlock,Region *tryRegion)

{
  code *pcVar1;
  bool bVar2;
  RegionType RVar3;
  BOOLEAN BVar4;
  BVIndex BVar5;
  JitArenaAllocator *pJVar6;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined4 *puVar7;
  Region *pRVar8;
  BVUnitT<unsigned_long> local_a0;
  SparseBVUnit _unit_1;
  BVIndex _startIndex_1;
  BVIndex _offset_1;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode_1;
  BVIndex id_1;
  Region *parentTry;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  TrackAllocData local_48;
  Region *local_20;
  Region *tryRegion_local;
  BasicBlock *catchOrFinallyBlock_local;
  BackwardPass *this_local;
  
  pJVar6 = this->func->m_alloc;
  local_20 = tryRegion;
  tryRegion_local = (Region *)catchOrFinallyBlock;
  catchOrFinallyBlock_local = (BasicBlock *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
             ,0x2287);
  pJVar6 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar6,&local_48);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar6,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->func->m_alloc);
  local_20->writeThroughSymbolsSet = this_00;
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if (bVar2) {
    if (tryRegion_local[3].writeThroughSymbolsSet == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x228b,"(catchOrFinallyBlock->byteCodeUpwardExposedUsed)",
                         "catchOrFinallyBlock->byteCodeUpwardExposedUsed");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(tryRegion_local[3].writeThroughSymbolsSet);
    if (!bVar2) {
      for (__startIndex = (tryRegion_local[3].writeThroughSymbolsSet)->head;
          __startIndex != (Type_conflict)0x0; __startIndex = __startIndex->next) {
        _unit.word._0_4_ = __startIndex->startIndex;
        parentTry = (Region *)(__startIndex->data).word;
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&parentTry);
        while (_unit.word._4_4_ != 0xffffffff) {
          BVar5 = (Type)_unit.word + _unit.word._4_4_;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&parentTry,_unit.word._4_4_);
          BVSparse<Memory::JitArenaAllocator>::Set(local_20->writeThroughSymbolsSet,BVar5);
          _unit.word._4_4_ =
               BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&parentTry);
        }
        if (__startIndex == (Type_conflict)0x0) break;
      }
    }
    pRVar8 = Region::GetParent(local_20);
    RVar3 = Region::GetType(pRVar8);
    if (RVar3 == RegionTypeTry) {
      pRVar8 = Region::GetParent(local_20);
      if (pRVar8->writeThroughSymbolsSet == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x22a8,"(parentTry->writeThroughSymbolsSet)",
                           "parentTry->writeThroughSymbolsSet");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      for (__startIndex_1 = pRVar8->writeThroughSymbolsSet->head;
          __startIndex_1 != (Type_conflict)0x0; __startIndex_1 = __startIndex_1->next) {
        _unit_1.word._0_4_ = __startIndex_1->startIndex;
        local_a0.word = (__startIndex_1->data).word;
        _unit_1.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_a0);
        while (_unit_1.word._4_4_ != 0xffffffff) {
          BVar5 = (Type)_unit_1.word + _unit_1.word._4_4_;
          BVUnitT<unsigned_long>::Clear(&local_a0,_unit_1.word._4_4_);
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test(local_20->writeThroughSymbolsSet,BVar5);
          if (BVar4 == '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x22ab,"(tryRegion->writeThroughSymbolsSet->Test(id))",
                               "tryRegion->writeThroughSymbolsSet->Test(id)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          _unit_1.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_a0);
        }
        if (__startIndex_1 == (Type_conflict)0x0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::SetWriteThroughSymbolsSetForRegion(BasicBlock * catchOrFinallyBlock, Region * tryRegion)
{
    tryRegion->writeThroughSymbolsSet = JitAnew(this->func->m_alloc, BVSparse<JitArenaAllocator>, this->func->m_alloc);

    if (this->DoByteCodeUpwardExposedUsed())
    {
        Assert(catchOrFinallyBlock->byteCodeUpwardExposedUsed);
        if (!catchOrFinallyBlock->byteCodeUpwardExposedUsed->IsEmpty())
        {
            FOREACH_BITSET_IN_SPARSEBV(id, catchOrFinallyBlock->byteCodeUpwardExposedUsed)
            {
                tryRegion->writeThroughSymbolsSet->Set(id);
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#if DBG
        // Symbols write-through in the parent try region should be marked as write-through in the current try region as well.
        // x =
        // try{
        //      try{
        //          x =         <-- x needs to be write-through here. With the current mechanism of not clearing a write-through
        //                          symbol from the bytecode upward-exposed on a def, x should be marked as write-through as
        //                          write-through symbols for a try are basically the bytecode upward exposed symbols at the
        //                          beginning of the corresponding catch block).
        //                          Verify that it still holds.
        //          <exception>
        //      }
        //      catch(){}
        //      x =
        // }
        // catch(){}
        // = x
        if (tryRegion->GetParent()->GetType() == RegionTypeTry)
        {
            Region * parentTry = tryRegion->GetParent();
            Assert(parentTry->writeThroughSymbolsSet);
            FOREACH_BITSET_IN_SPARSEBV(id, parentTry->writeThroughSymbolsSet)
            {
                Assert(tryRegion->writeThroughSymbolsSet->Test(id));
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#endif
    }
    else
    {
        // this can happen with -off:globopt
        return;
    }
}